

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineSearchBasedMethod.cpp
# Opt level: O1

Type __thiscall
QuantLib::LineSearchBasedMethod::minimize
          (LineSearchBasedMethod *this,Problem *P,EndCriteria *endCriteria,RealType initialStepSize)

{
  DynamicVector<double,_std::allocator<double>_> *__x;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  Type TVar4;
  pointer pdVar5;
  EndCriteria *this_00;
  bool bVar6;
  pointer pdVar7;
  bool bVar8;
  size_type __n;
  size_t iteration;
  RealType extraout_XMM0_Qa;
  RealType RVar9;
  RealType extraout_XMM0_Qa_00;
  double dVar10;
  Type ecType;
  DynamicVector<double,_std::allocator<double>_> tmp;
  DynamicVector<double,_std::allocator<double>_> prevGradient;
  DynamicVector<double,_std::allocator<double>_> x_;
  DynamicVector<double,_std::allocator<double>_> d;
  size_t maxStationaryStateIterations_;
  Type local_10c;
  DynamicVector<double,_std::allocator<double>_> local_108;
  DynamicVector<double,_std::allocator<double>_> local_f0;
  DynamicVector<double,_std::allocator<double>_> local_d8;
  EndCriteria *local_c0;
  vector<double,_std::allocator<double>_> local_b8;
  vector<double,_std::allocator<double>_> local_a0;
  RealType local_88;
  vector<double,_std::allocator<double>_> local_80;
  RealType *local_68;
  RealType local_60;
  RealType local_58;
  size_t local_50;
  RealType local_48;
  undefined8 uStack_40;
  
  local_88 = initialStepSize;
  local_60 = EndCriteria::functionEpsilon(endCriteria);
  local_50 = EndCriteria::maxStationaryStateIterations(endCriteria);
  local_10c = None;
  P->functionValue_ = 0.0;
  P->squaredNorm_ = 0.0;
  P->functionEvaluation_ = 0;
  P->gradientEvaluation_ = 0;
  __x = &P->currentValue_;
  std::vector<double,_std::allocator<double>_>::vector(&local_a0,&__x->data_);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_f0.data_,
             (long)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3,(allocator_type *)&local_80);
  std::vector<double,_std::allocator<double>_>::_M_move_assign
            (&(this->lineSearch_->searchDirection_).data_,&local_f0);
  if (local_f0.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f0.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  __n = (long)(this->lineSearch_->searchDirection_).data_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_finish -
        (long)(this->lineSearch_->searchDirection_).data_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start >> 3;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_f0.data_,__n,(allocator_type *)&local_80);
  std::vector<double,_std::allocator<double>_>::vector(&local_80,__n,(allocator_type *)&local_b8);
  std::vector<double,_std::allocator<double>_>::vector(&local_b8,__n,(allocator_type *)&local_d8);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_d8.data_,__n,(allocator_type *)&local_108);
  uVar1 = P->functionEvaluation_;
  uVar2 = P->gradientEvaluation_;
  P->functionEvaluation_ = uVar1 + 1;
  P->gradientEvaluation_ = uVar2 + 1;
  (*P->objectiveFunction_->_vptr_ObjectiveFunction[4])(P->objectiveFunction_,&local_f0,&local_a0);
  P->functionValue_ = extraout_XMM0_Qa;
  (*P->statusFunction_->_vptr_StatusFunction[2])
            (P->statusFunction_,(ulong)(uint)P->functionEvaluation_,
             (ulong)(uint)P->gradientEvaluation_,__x);
  RVar9 = Problem::DotProduct(P,&local_f0,&local_f0);
  P->squaredNorm_ = RVar9;
  std::vector<double,_std::allocator<double>_>::vector(&local_108.data_,&local_f0.data_);
  auVar3 = _DAT_00294440;
  for (pdVar7 = local_108.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar7 != local_108.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar7 = pdVar7 + 1) {
    *pdVar7 = (double)((ulong)*pdVar7 ^ auVar3._0_8_);
  }
  local_c0 = endCriteria;
  std::vector<double,_std::allocator<double>_>::_M_move_assign
            (&(this->lineSearch_->searchDirection_).data_,&local_108);
  if (local_108.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_108.data_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.data_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_68 = &P->functionValue_;
  bVar6 = true;
  bVar8 = false;
  iteration = 0;
  do {
    local_48 = P->functionValue_;
    uStack_40 = 0;
    local_58 = P->squaredNorm_;
    if (!bVar6) {
      std::vector<double,_std::allocator<double>_>::operator=
                (&local_f0.data_,&(this->lineSearch_->gradient_).data_);
    }
    (*this->lineSearch_->_vptr_LineSearch[2])(local_88,this->lineSearch_,P,&local_10c,local_c0);
    local_88 = extraout_XMM0_Qa_00;
    if (this->lineSearch_->succeed_ == true) {
      std::vector<double,_std::allocator<double>_>::operator=
                (&local_a0,&(this->lineSearch_->xtd_).data_);
      std::vector<double,_std::allocator<double>_>::operator=(&__x->data_,&local_a0);
      (*P->statusFunction_->_vptr_StatusFunction[2])
                (P->functionValue_,P->statusFunction_,(ulong)(uint)P->functionEvaluation_,
                 (ulong)(uint)P->gradientEvaluation_,__x);
      RVar9 = this->lineSearch_->qpt_;
      P->functionValue_ = this->lineSearch_->qt_;
      P->squaredNorm_ = RVar9;
      (*(this->super_OptimizationMethod)._vptr_OptimizationMethod[3])
                (local_58,&local_108,this,P,&local_f0);
      pdVar5 = local_d8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      pdVar7 = local_d8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_d8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_108.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_d8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_108.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_d8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_108.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_108.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_108.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_108.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (pdVar7 != (pointer)0x0) {
        operator_delete(pdVar7,(long)pdVar5 - (long)pdVar7);
      }
      if (local_108.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_108.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_108.data_.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_108.data_.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      OpenMD::operator-(&local_108,&local_d8,&this->lineSearch_->searchDirection_);
      pdVar5 = local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      pdVar7 = local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = local_108.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_108.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           local_108.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_108.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_108.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_108.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (pdVar7 != (pointer)0x0) {
        operator_delete(pdVar7,(long)pdVar5 - (long)pdVar7);
      }
      if (local_108.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_108.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_108.data_.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_108.data_.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::vector<double,_std::allocator<double>_>::operator=
                (&(this->lineSearch_->searchDirection_).data_,&local_d8.data_);
      dVar10 = ABS(*local_68 - local_48);
      if (((dVar10 + dVar10) / (ABS(local_48) + ABS(*local_68) + 2.220446049250313e-16) < local_60)
         || (bVar6 = EndCriteria::checkMaxIterations(local_c0,iteration,&local_10c), bVar6)) {
        this_00 = local_c0;
        EndCriteria::checkStationaryFunctionValue(local_c0,0.0,0.0,&local_50,&local_10c);
        EndCriteria::checkMaxIterations(this_00,iteration,&local_10c);
        goto LAB_001c2c40;
      }
      std::vector<double,_std::allocator<double>_>::operator=(&__x->data_,&local_a0);
      (*P->statusFunction_->_vptr_StatusFunction[2])
                (P->functionValue_,P->statusFunction_,(ulong)(uint)P->functionEvaluation_,
                 (ulong)(uint)P->gradientEvaluation_,__x);
      iteration = iteration + 1;
      bVar6 = false;
    }
    else {
      bVar8 = true;
    }
    if (bVar8) {
      std::vector<double,_std::allocator<double>_>::operator=(&__x->data_,&local_a0);
      (*P->statusFunction_->_vptr_StatusFunction[2])
                (P->functionValue_,P->statusFunction_,(ulong)(uint)P->functionEvaluation_,
                 (ulong)(uint)P->gradientEvaluation_,__x);
LAB_001c2c40:
      TVar4 = local_10c;
      if (local_d8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_d8.data_.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_d8.data_.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_f0.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f0.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_f0.data_.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_f0.data_.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      return TVar4;
    }
  } while( true );
}

Assistant:

EndCriteria::Type LineSearchBasedMethod::minimize(
      Problem& P, const EndCriteria& endCriteria,
      RealType initialStepSize = 1.0) {
    // Initializations
    RealType ftol = endCriteria.functionEpsilon();
    size_t maxStationaryStateIterations_ =
        endCriteria.maxStationaryStateIterations();
    EndCriteria::Type ecType = EndCriteria::None;   // reset end criteria
    P.reset();                                      // reset problem
    DynamicVector<RealType> x_ = P.currentValue();  // store the starting point
    size_t iterationNumber_    = 0;
    // dimension line search
    lineSearch_->searchDirection() = DynamicVector<RealType>(x_.size());
    bool done                      = false;

    // function and squared norm of gradient values;
    RealType fnew, fold, gold2;
    RealType fdiff;
    // classical initial value for line-search step
    // RealType t = 1.0;
    // new initial value for line-search step
    RealType t = initialStepSize;
    // Set gradient g at the size of the optimization problem
    // search direction
    size_t sz = lineSearch_->searchDirection().size();
    DynamicVector<RealType> prevGradient(sz), d(sz), sddiff(sz), direction(sz);
    // Initialize objective function, gradient prevGradient and
    // search direction

    P.setFunctionValue(P.valueAndGradient(prevGradient, x_));
    P.setGradientNormValue(P.DotProduct(prevGradient, prevGradient));
    lineSearch_->searchDirection() = -prevGradient;

    bool first_time = true;
    // Loop over iterations
    do {
      fold  = P.functionValue();
      gold2 = P.gradientNormValue();

      // Linesearch
      if (!first_time) prevGradient = lineSearch_->lastGradient();

      t = (*lineSearch_)(P, ecType, endCriteria, t);

      // don't throw: it can fail just because maxIterations exceeded
      // QL_REQUIRE(lineSearch_->succeed(), "line-search failed!");
      if (lineSearch_->succeed()) {
        // Updates
        // New point
        x_ = lineSearch_->lastX();
        P.setCurrentValue(x_);
        // New function value
        P.setFunctionValue(lineSearch_->lastFunctionValue());
        // New gradient and search direction vectors

        // orthogonalization coef
        P.setGradientNormValue(lineSearch_->lastGradientNorm2());

        // conjugate gradient search direction
        direction = getUpdatedDirection(P, gold2, prevGradient);

        sddiff = direction - lineSearch_->searchDirection();

        lineSearch_->searchDirection() = direction;
        // Now compute accuracy and check end criteria
        // Numerical Recipes exit strategy on fx (see NR in C++, p.423)

        fnew  = P.functionValue();
        fdiff = 2.0 * std::fabs(fnew - fold) /
                (std::fabs(fnew) + std::fabs(fold) +
                 std::numeric_limits<RealType>::epsilon());

        if (fdiff < ftol ||
            endCriteria.checkMaxIterations(iterationNumber_, ecType)) {
          endCriteria.checkStationaryFunctionValue(
              0.0, 0.0, maxStationaryStateIterations_, ecType);
          endCriteria.checkMaxIterations(iterationNumber_, ecType);
          return ecType;
        }
        P.setCurrentValue(x_);  // update problem current value
        ++iterationNumber_;     // Increase iteration number
        first_time = false;
      } else {
        done = true;
      }
    } while (!done);
    P.setCurrentValue(x_);
    return ecType;
  }